

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.h
# Opt level: O1

Point2f __thiscall pbrt::detail::Hammersley2DIter::operator*(Hammersley2DIter *this)

{
  int iVar1;
  ulong uVar2;
  long lVar3;
  bool bVar4;
  float fVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 in_ZMM2 [64];
  
  iVar1 = (this->super_IndexingIterator<pbrt::detail::Hammersley2DIter>).i;
  if ((long)iVar1 == 0) {
    auVar6 = ZEXT816(0) << 0x40;
  }
  else {
    fVar5 = 1.0;
    lVar3 = 0;
    uVar2 = (long)iVar1;
    do {
      lVar3 = (lVar3 - uVar2 / 2) * 2 + uVar2;
      fVar5 = fVar5 * 0.5;
      bVar4 = 1 < uVar2;
      uVar2 = uVar2 / 2;
    } while (bVar4);
    auVar6 = vcvtusi2ss_avx512f(in_ZMM2._0_16_,lVar3);
    auVar6 = ZEXT416((uint)(fVar5 * auVar6._0_4_));
  }
  auVar7._0_4_ = (float)iVar1 /
                 (float)(this->super_IndexingIterator<pbrt::detail::Hammersley2DIter>).n;
  auVar7._4_12_ = in_ZMM2._4_12_;
  auVar6 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),auVar6);
  auVar6 = vinsertps_avx(auVar7,auVar6,0x10);
  return (Point2f)auVar6._0_8_;
}

Assistant:

PBRT_CPU_GPU
    Point2f operator*() { return {Float(i) / Float(n), RadicalInverse(0, i)}; }